

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O0

void aom_get_var_sse_sum_8x8_quad_avx2
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse8x8,
               int *sum8x8,uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  uint32_t *in_R9;
  int *in_stack_00000008;
  uint *in_stack_00000010;
  int *in_stack_00000018;
  uint32_t *in_stack_000000d8;
  int in_stack_000000e0;
  int in_stack_000000e4;
  uint8_t *in_stack_000000e8;
  int in_stack_000000f4;
  uint8_t *in_stack_000000f8;
  
  get_var_sse_sum_8x8_quad_avx2
            (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,in_stack_000000e4,
             in_stack_000000e0,in_stack_000000d8,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_R9);
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_avx2(const uint8_t *src_ptr,
                                       int source_stride,
                                       const uint8_t *ref_ptr, int ref_stride,
                                       uint32_t *sse8x8, int *sum8x8,
                                       unsigned int *tot_sse, int *tot_sum,
                                       uint32_t *var8x8) {
  get_var_sse_sum_8x8_quad_avx2(src_ptr, source_stride, ref_ptr, ref_stride, 8,
                                sse8x8, sum8x8, tot_sse, tot_sum, var8x8);
}